

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O3

t_object * __thiscall
xemmai::t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<xemmai::portable::t_path>>
          (t_type_of<xemmai::t_object> *this,t_object *a_module,t_fields *a_fields)

{
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  undefined8 *puVar2;
  t_object *ptVar3;
  undefined1 local_78 [72];
  
  xemmai::t_type_of<xemmai::t_object>::f_merge((t_fields *)local_78);
  puVar2 = (undefined8 *)__tls_get_addr(&PTR_0011ed28);
  ptVar3 = t_engine::f_allocate_for_type<xemmai::t_type_of<xemmai::portable::t_path>>
                     ((t_engine *)*puVar2,
                      ((long)(local_78._8_8_ - local_78._0_8_) >> 3) * -0x5555555555555555);
  t_type_of<2ul>((t_type_of<xemmai::t_object> *)ptVar3->v_data,
                 &t_bears<xemmai::portable::t_path,_xemmai::t_type_of<xemmai::t_object>_>::c_IDS,
                 this,a_module,0x20,
                 ((long)(a_fields->v_instance).
                        super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(a_fields->v_instance).
                        super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + this->v_instance_fields,
                 (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                  *)local_78,
                 (map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
                  *)(local_78 + 0x18));
  ptVar3[1].v_next_cycle = (t_object *)t_type_of<xemmai::portable::t_path>::f_do_construct;
  ptVar3[1].v_type = (t_type *)0x0;
  *(code **)ptVar3[2].v_data = t_type_of<xemmai::portable::t_path>::f_do_divide;
  ptVar3[1].v_rank =
       (size_t)t_finalizes<xemmai::t_bears<xemmai::portable::t_path,_xemmai::t_type_of<xemmai::t_object>_>_>
               ::f_do_finalize;
  *(code **)&ptVar3[1].v_color =
       t_derivable<xemmai::t_holds<xemmai::portable::t_path,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::portable::t_path>_>_>
       ::f_do_derive;
  ptVar3[1].v_count = 0;
  ptVar1 = (t_type *)this[-1].f_or;
  puVar2 = (undefined8 *)__tls_get_addr(&PTR_0011ed00);
  this_00 = (t_queue<128UL> *)*puVar2;
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar3->v_type = ptVar1;
  puVar2 = (undefined8 *)__tls_get_addr(&PTR_0011ed50);
  this_01 = (t_queue<256UL> *)*puVar2;
  *this_01->v_head = ptVar3;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  std::
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
               *)(local_78 + 0x18));
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *)local_78);
  return ptVar3;
}

Assistant:

t_object* t_type::f_derive(t_object* a_module, const t_fields& a_fields)
{
	auto [fields, key2index] = f_merge(a_fields);
	auto p = f_engine()->f_allocate_for_type<T>(fields.size());
	new(p->f_data()) T(T::c_IDS, this, a_module, T::c_NATIVE, v_instance_fields + a_fields.v_instance.size(), fields, key2index);
	p->f_be(t_object::f_of(this)->v_type);
	return p;
}